

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20250127::container_internal::
     map_slot_policy<google::protobuf::Descriptor_const*,google::protobuf::DescriptorBuilder::MessageHints>
     ::
     transfer<std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>>
               (allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  undefined4 uVar1;
  pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>
  *ppVar2;
  undefined1 local_21;
  slot_type *psStack_20;
  type is_relocatable;
  slot_type *old_slot_local;
  slot_type *new_slot_local;
  allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>
  *alloc_local;
  
  psStack_20 = old_slot;
  memset(&local_21,0,1);
  map_slot_policy<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints>
  ::emplace(new_slot);
  ppVar2 = std::
           launder<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::DescriptorBuilder::MessageHints>>
                     (&new_slot->value);
  ppVar2->first = (psStack_20->value).first;
  uVar1 = *(undefined4 *)&((MessageHints *)((long)psStack_20 + 8))->field_0x4;
  (ppVar2->second).fields_to_suggest = ((MessageHints *)((long)psStack_20 + 8))->fields_to_suggest;
  *(undefined4 *)&(ppVar2->second).field_0x4 = uVar1;
  (ppVar2->second).first_reason = (psStack_20->value).second.first_reason;
  uVar1 = *(undefined4 *)&((MessageHints *)((long)psStack_20 + 8))->field_0x14;
  (ppVar2->second).first_reason_location =
       ((MessageHints *)((long)psStack_20 + 8))->first_reason_location;
  *(undefined4 *)&(ppVar2->second).field_0x14 = uVar1;
  return;
}

Assistant:

static auto transfer(Allocator* alloc, slot_type* new_slot,
                       slot_type* old_slot) {
    auto is_relocatable =
        typename absl::is_trivially_relocatable<value_type>::type();

    emplace(new_slot);
#if defined(__cpp_lib_launder) && __cpp_lib_launder >= 201606
    if (is_relocatable) {
      // TODO(b/247130232,b/251814870): remove casts after fixing warnings.
      std::memcpy(static_cast<void*>(std::launder(&new_slot->value)),
                  static_cast<const void*>(&old_slot->value),
                  sizeof(value_type));
      return is_relocatable;
    }
#endif

    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(
          *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
                                                   std::move(old_slot->value));
    }
    destroy(alloc, old_slot);
    return is_relocatable;
  }